

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

bool __thiscall Moc::until(Moc *this,Token target)

{
  Symbol *pSVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  Token TVar12;
  Token *pTVar13;
  
  pSVar1 = (this->super_Parser).symbols.d.ptr;
  lVar4 = (this->super_Parser).index;
  iVar8 = 0;
  if (lVar4 == 0) {
    iVar9 = 0;
    iVar11 = 0;
    iVar5 = 0;
  }
  else {
    uVar10 = pSVar1[lVar4 + -1].token - LANGLE;
    iVar9 = 0;
    iVar11 = 0;
    iVar5 = 0;
    iVar8 = 0;
    if (uVar10 < 8) {
      uVar6 = (ulong)uVar10;
      iVar8 = *(int *)(&DAT_0013707c + uVar6 * 4);
      iVar9 = *(int *)(&DAT_0013709c + uVar6 * 4);
      iVar11 = *(int *)(&DAT_001370bc + uVar6 * 4);
      iVar5 = *(int *)(&DAT_001370dc + uVar6 * 4);
    }
  }
  lVar2 = (this->super_Parser).symbols.d.size;
  pTVar13 = &pSVar1[lVar4].token;
  lVar7 = -1;
  do {
    if (lVar2 <= lVar4) break;
    (this->super_Parser).index = lVar4 + 1;
    TVar12 = *pTVar13;
    switch(TVar12) {
    case LANGLE:
      if (iVar11 == 0 && iVar8 == 0) {
        iVar5 = iVar5 + 1;
        iVar8 = 0;
        iVar11 = 0;
      }
      TVar12 = LANGLE;
      break;
    case PP_RANGLE:
      if (iVar11 == 0 && iVar8 == 0) {
        iVar5 = iVar5 + -1;
LAB_001137c7:
        iVar8 = 0;
        iVar11 = 0;
      }
      TVar12 = PP_RANGLE;
      break;
    case LPAREN:
      iVar11 = iVar11 + 1;
      TVar12 = LPAREN;
      break;
    case PP_RPAREN:
      iVar11 = iVar11 + -1;
      TVar12 = PP_RPAREN;
      break;
    case ELIPSIS:
      break;
    case LBRACK:
      iVar9 = iVar9 + 1;
      TVar12 = LBRACK;
      break;
    case RBRACK:
      iVar9 = iVar9 + -1;
      TVar12 = RBRACK;
      break;
    case LBRACE:
      iVar8 = iVar8 + 1;
      TVar12 = LBRACE;
      break;
    case RBRACE:
      iVar8 = iVar8 + -1;
      TVar12 = RBRACE;
      break;
    default:
      if (TVar12 == GTGT) {
        if (iVar11 == 0 && iVar8 == 0) {
          iVar5 = iVar5 + -2;
          goto LAB_001137c7;
        }
        TVar12 = GTGT;
      }
    }
    if (((((TVar12 == target) && (iVar8 < 1)) && (iVar9 < 1)) && (iVar11 < 1)) &&
       ((target != PP_RANGLE || (iVar5 < 1)))) {
      if (target != COMMA) {
        return true;
      }
      lVar7 = lVar4 + 1;
      if (iVar5 < 1) {
        return true;
      }
    }
    if (((target == COMMA) && (TVar12 == EQ)) && (lVar7 != -1)) goto LAB_00113885;
    if ((((iVar8 < 0) || (iVar9 < 0)) || (iVar11 < 0)) || (target == PP_RANGLE && iVar5 < 0)) {
      (this->super_Parser).index = lVar4;
      break;
    }
    pTVar13 = pTVar13 + 0xc;
    lVar4 = lVar4 + 1;
  } while ((0 < iVar8) || (TVar12 != SEMIC));
  bVar3 = false;
  if ((target == COMMA) && ((bVar3 = false, iVar5 != 0 && (bVar3 = false, lVar7 != -1)))) {
LAB_00113885:
    (this->super_Parser).index = lVar7;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Moc::until(Token target) {
    int braceCount = 0;
    int brackCount = 0;
    int parenCount = 0;
    int angleCount = 0;
    if (index) {
        switch(symbols.at(index-1).token) {
        case LBRACE: ++braceCount; break;
        case LBRACK: ++brackCount; break;
        case LPAREN: ++parenCount; break;
        case LANGLE: ++angleCount; break;
        default: break;
        }
    }

    //when searching commas within the default argument, we should take care of template depth (anglecount)
    // unfortunately, we do not have enough semantic information to know if '<' is the operator< or
    // the beginning of a template type. so we just use heuristics.
    qsizetype possible = -1;

    while (index < symbols.size()) {
        Token t = symbols.at(index++).token;
        switch (t) {
        case LBRACE: ++braceCount; break;
        case RBRACE: --braceCount; break;
        case LBRACK: ++brackCount; break;
        case RBRACK: --brackCount; break;
        case LPAREN: ++parenCount; break;
        case RPAREN: --parenCount; break;
        case LANGLE:
            if (parenCount == 0 && braceCount == 0)
                ++angleCount;
          break;
        case RANGLE:
            if (parenCount == 0 && braceCount == 0)
                --angleCount;
          break;
        case GTGT:
            if (parenCount == 0 && braceCount == 0) {
                angleCount -= 2;
                t = RANGLE;
            }
            break;
        default: break;
        }
        if (t == target
            && braceCount <= 0
            && brackCount <= 0
            && parenCount <= 0
            && (target != RANGLE || angleCount <= 0)) {
            if (target != COMMA || angleCount <= 0)
                return true;
            possible = index;
        }

        if (target == COMMA && t == EQ && possible != -1) {
            index = possible;
            return true;
        }

        if (braceCount < 0 || brackCount < 0 || parenCount < 0
            || (target == RANGLE && angleCount < 0)) {
            --index;
            break;
        }

        if (braceCount <= 0 && t == SEMIC) {
            // Abort on semicolon. Allow recovering bad template parsing (QTBUG-31218)
            break;
        }
    }

    if (target == COMMA && angleCount != 0 && possible != -1) {
        index = possible;
        return true;
    }

    return false;
}